

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_sink.c
# Opt level: O0

void sink_mark_snap(jit_State *J,SnapShot *snap)

{
  byte bVar1;
  uint uVar2;
  SnapEntry *pSVar3;
  IRIns *pIVar4;
  uint uVar5;
  IRRef ref;
  MSize nent;
  MSize n;
  SnapEntry *map;
  SnapShot *snap_local;
  jit_State *J_local;
  
  pSVar3 = (J->cur).snapmap;
  uVar2 = snap->mapofs;
  bVar1 = snap->nent;
  for (ref = 0; ref < bVar1; ref = ref + 1) {
    uVar5 = pSVar3[(ulong)uVar2 + (ulong)ref] & 0xffff;
    if (0x7fff < uVar5) {
      pIVar4 = (J->cur).ir;
      *(byte *)((long)pIVar4 + (ulong)uVar5 * 8 + 4) =
           *(byte *)((long)pIVar4 + (ulong)uVar5 * 8 + 4) | 0x20;
    }
  }
  return;
}

Assistant:

static void sink_mark_snap(jit_State *J, SnapShot *snap)
{
  SnapEntry *map = &J->cur.snapmap[snap->mapofs];
  MSize n, nent = snap->nent;
  for (n = 0; n < nent; n++) {
    IRRef ref = snap_ref(map[n]);
    if (!irref_isk(ref))
      irt_setmark(IR(ref)->t);
  }
}